

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

RemotePromise<capnp::AnyPointer> * __thiscall
capnp::LocalRequest::sendImpl
          (RemotePromise<capnp::AnyPointer> *__return_storage_ptr__,LocalRequest *this,
          bool isStreaming)

{
  ushort uVar1;
  uint64_t uVar2;
  bool bVar3;
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> *params;
  ClientHook *pCVar4;
  RefOrVoid<capnp::LocalCallContext> object;
  Own<capnp::LocalCallContext,_std::nullptr_t> *other;
  Promise<capnp::Response<capnp::AnyPointer>_> *promise_00;
  Own<capnp::PipelineHook,_std::nullptr_t> *hook;
  Pipeline local_118;
  Own<capnp::LocalCallContext,_std::nullptr_t> local_f0;
  Promise<void> local_e0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:271:52),_void>
  promise;
  undefined1 local_d0 [16];
  Own<capnp::CallContextHook,_std::nullptr_t> local_c0;
  undefined1 local_b0 [8];
  VoidPromiseAndPipeline promiseAndPipeline;
  undefined1 local_88 [8];
  Own<capnp::LocalCallContext,_std::nullptr_t> context;
  Fault local_68;
  Fault f;
  MallocMessageBuilder *local_58;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_&> local_50;
  undefined1 local_48 [8];
  DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> _kjCondition;
  bool isStreaming_local;
  LocalRequest *this_local;
  
  _kjCondition._39_1_ = isStreaming;
  local_58 = kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::get(&this->message);
  local_50.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::MallocMessageBuilder*>::operator!=
            ((DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> *)local_48,
             (DebugExpression<capnp::MallocMessageBuilder*> *)&local_50,&f.exception);
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::MallocMessageBuilder*,decltype(nullptr)>&,char_const(&)[39]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x109,FAILED,"message.get() != nullptr",
               "_kjCondition,\"Already called send() on this request.\"",
               (DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> *)local_48,
               (char (*) [39])"Already called send() on this request.");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  params = kj::mv<kj::Own<capnp::MallocMessageBuilder,decltype(nullptr)>>(&this->message);
  pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->client);
  (*pCVar4->_vptr_ClientHook[4])();
  kj::
  refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder,decltype(nullptr)>,kj::Own<capnp::ClientHook,decltype(nullptr)>,capnp::Capability::Client::CallHints&,bool&>
            ((kj *)local_88,params,
             (Own<capnp::ClientHook,_std::nullptr_t> *)&promiseAndPipeline.pipeline.ptr,&this->hints
             ,(bool *)&_kjCondition.field_0x27);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&promiseAndPipeline.pipeline.ptr);
  pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->client);
  uVar2 = this->interfaceId;
  uVar1 = this->methodId;
  object = kj::Own<capnp::LocalCallContext,_std::nullptr_t>::operator*
                     ((Own<capnp::LocalCallContext,_std::nullptr_t> *)local_88);
  kj::addRef<capnp::LocalCallContext>((kj *)local_d0,object);
  kj::Own<capnp::CallContextHook,decltype(nullptr)>::Own<capnp::LocalCallContext,void>
            ((Own<capnp::CallContextHook,decltype(nullptr)> *)(local_d0 + 0x10),
             (Own<capnp::LocalCallContext,_std::nullptr_t> *)local_d0);
  promise.super_PromiseBase.node.ptr._6_2_ = this->hints;
  (*pCVar4->_vptr_ClientHook[1])
            (local_b0,pCVar4,uVar2,(ulong)uVar1,
             (Own<capnp::CallContextHook,decltype(nullptr)> *)(local_d0 + 0x10),
             (ulong)(ushort)promise.super_PromiseBase.node.ptr._6_2_);
  kj::Own<capnp::CallContextHook,_std::nullptr_t>::~Own
            ((Own<capnp::CallContextHook,_std::nullptr_t> *)(local_d0 + 0x10));
  kj::Own<capnp::LocalCallContext,_std::nullptr_t>::~Own
            ((Own<capnp::LocalCallContext,_std::nullptr_t> *)local_d0);
  other = kj::mv<kj::Own<capnp::LocalCallContext,decltype(nullptr)>>
                    ((Own<capnp::LocalCallContext,_std::nullptr_t> *)local_88);
  kj::Own<capnp::LocalCallContext,_std::nullptr_t>::Own(&local_f0,other);
  kj::Promise<void>::then<capnp::LocalRequest::sendImpl(bool)::_lambda()_1_>
            (&local_e0,(Type *)local_b0);
  sendImpl(bool)::{lambda()#1}::~sendImpl((_lambda___1_ *)&local_f0);
  promise_00 = kj::mv<kj::Promise<capnp::Response<capnp::AnyPointer>>>
                         ((Promise<capnp::Response<capnp::AnyPointer>_> *)&local_e0);
  hook = kj::mv<kj::Own<capnp::PipelineHook,decltype(nullptr)>>
                   ((Own<capnp::PipelineHook,_std::nullptr_t> *)&promiseAndPipeline);
  AnyPointer::Pipeline::Pipeline(&local_118,hook);
  RemotePromise<capnp::AnyPointer>::RemotePromise(__return_storage_ptr__,promise_00,&local_118);
  AnyPointer::Pipeline::~Pipeline(&local_118);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)&local_e0);
  ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline((VoidPromiseAndPipeline *)local_b0);
  kj::Own<capnp::LocalCallContext,_std::nullptr_t>::~Own
            ((Own<capnp::LocalCallContext,_std::nullptr_t> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<AnyPointer> sendImpl(bool isStreaming) {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    auto context = kj::refcounted<LocalCallContext>(kj::mv(message), client->addRef(), hints, isStreaming);
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context), hints);

    // Now the other branch returns the response from the context.
    auto promise = promiseAndPipeline.promise.then([context=kj::mv(context)]() mutable {
      // force response allocation
      auto reader = context->getResults(MessageSize { 0, 0 }).asReader();

      if (context->isShared()) {
        // We can't just move away context->response as `context` itself is still referenced by
        // something -- probably a Pipeline object. As a bit of a hack, LocalCallContext itself
        // implements ResponseHook so that we can just return a ref on it.
        //
        // TODO(cleanup): Maybe ResponseHook should be refcounted? Note that context->response
        //   might not necessarily contain a LocalResponse if it was resolved by a tail call, so
        //   we'd have to add refcounting to all ResponseHook implementations.
        context->releaseParams();      // The call is done so params can definitely be dropped.
        context->clientRef = nullptr;  // Definitely not using the client cap anymore either.
        return Response<AnyPointer>(reader, kj::mv(context));
      } else {
        return kj::mv(KJ_ASSERT_NONNULL(context->response));
      }
    });

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }